

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result wabt::interp::Match(GlobalType *expected,GlobalType *actual,string *out_msg)

{
  Mutability MVar1;
  int iVar2;
  Enum EVar3;
  char *pcVar4;
  char *pcVar5;
  char *format;
  string local_40;
  
  MVar1 = expected->mut;
  if (actual->mut == MVar1) {
    iVar2 = *(int *)&(actual->super_ExternType).field_0xc;
    local_40._M_dataplus._M_p._0_4_ = *(int *)&(expected->super_ExternType).field_0xc;
    EVar3 = Ok;
    if (iVar2 == (int)local_40._M_dataplus._M_p) {
      return (Result)Ok;
    }
    if (MVar1 != Var) {
      switch((int)local_40._M_dataplus._M_p) {
      case -0x18:
      case -0x12:
      case -0x10:
switchD_00244bfb_caseD_ffffffe8:
        if (iVar2 == -0x12) {
          return (Result)Ok;
        }
        break;
      case -0x17:
      case -0x16:
      case -0x15:
      case -0x14:
      case -0x13:
        break;
      case -0x11:
        goto switchD_00244bfb_caseD_ffffffef;
      default:
        if ((int)local_40._M_dataplus._M_p == 2) goto switchD_00244bfb_caseD_ffffffe8;
      }
    }
    pcVar4 = Type::GetName((Type *)&local_40);
    local_40._M_dataplus._M_p._0_4_ = *(int *)&(actual->super_ExternType).field_0xc;
    pcVar5 = Type::GetName((Type *)&local_40);
    format = "type mismatch in imported global, expected %s but got %s.";
  }
  else {
    pcVar4 = GetName::kNames[(int)actual->mut];
    pcVar5 = GetName::kNames[(int)MVar1];
    format = "mutability mismatch in imported global, expected %s but got %s.";
  }
  StringPrintf_abi_cxx11_(&local_40,format,pcVar4,pcVar5);
  std::__cxx11::string::operator=((string *)out_msg,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(int)local_40._M_dataplus._M_p) !=
      &local_40.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_40._M_dataplus._M_p._4_4_,(int)local_40._M_dataplus._M_p));
  }
  EVar3 = Error;
switchD_00244bfb_caseD_ffffffef:
  return (Result)EVar3;
}

Assistant:

Result Match(const GlobalType& expected,
             const GlobalType& actual,
             std::string* out_msg) {
  if (actual.mut != expected.mut) {
    *out_msg = StringPrintf(
        "mutability mismatch in imported global, expected %s but got %s.",
        GetName(actual.mut), GetName(expected.mut));
    return Result::Error;
  }

  if (actual.type != expected.type &&
      (expected.mut == Mutability::Var ||
       !TypesMatch(expected.type, actual.type))) {
    *out_msg = StringPrintf(
        "type mismatch in imported global, expected %s but got %s.",
        GetName(expected.type), GetName(actual.type));
    return Result::Error;
  }

  return Result::Ok;
}